

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_write_indicator
              (yaml_emitter_t *emitter,char *indicator,int need_whitespace,int is_whitespace,
              int is_indention)

{
  yaml_char_t yVar1;
  yaml_char_t *pyVar2;
  int iVar3;
  size_t sVar4;
  yaml_char_t *pyVar5;
  bool local_5d;
  yaml_string_t string;
  size_t indicator_length;
  int is_indention_local;
  int is_whitespace_local;
  int need_whitespace_local;
  char *indicator_local;
  yaml_emitter_t *emitter_local;
  
  sVar4 = strlen(indicator);
  string.end = (yaml_char_t *)indicator;
  if ((need_whitespace != 0) && (emitter->whitespace == 0)) {
    if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
       (iVar3 = yaml_emitter_flush(emitter), iVar3 == 0)) {
      return 0;
    }
    pyVar2 = (emitter->buffer).pointer;
    (emitter->buffer).pointer = pyVar2 + 1;
    *pyVar2 = ' ';
    emitter->column = emitter->column + 1;
  }
  while( true ) {
    if (string.end == (yaml_char_t *)(indicator + sVar4)) {
      emitter->whitespace = is_whitespace;
      local_5d = emitter->indention != 0 && is_indention != 0;
      emitter->indention = (uint)local_5d;
      emitter->open_ended = 0;
      return 1;
    }
    if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
       (iVar3 = yaml_emitter_flush(emitter), iVar3 == 0)) break;
    if ((*string.end & 0x80) == 0) {
      yVar1 = *string.end;
      pyVar2 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
      string.end = string.end + 1;
    }
    else if ((*string.end & 0xe0) == 0xc0) {
      pyVar5 = string.end + 1;
      yVar1 = *string.end;
      pyVar2 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
      string.end = string.end + 2;
      yVar1 = *pyVar5;
      pyVar2 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
    }
    else if ((*string.end & 0xf0) == 0xe0) {
      yVar1 = *string.end;
      pyVar2 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
      pyVar5 = string.end + 2;
      yVar1 = string.end[1];
      pyVar2 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
      string.end = string.end + 3;
      yVar1 = *pyVar5;
      pyVar2 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
    }
    else if ((*string.end & 0xf8) == 0xf0) {
      yVar1 = *string.end;
      pyVar2 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
      yVar1 = string.end[1];
      pyVar2 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
      pyVar5 = string.end + 3;
      yVar1 = string.end[2];
      pyVar2 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
      string.end = string.end + 4;
      yVar1 = *pyVar5;
      pyVar2 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
    }
    emitter->column = emitter->column + 1;
  }
  return 0;
}

Assistant:

static int
yaml_emitter_write_indicator(yaml_emitter_t *emitter,
        const char *indicator, int need_whitespace,
        int is_whitespace, int is_indention)
{
    size_t indicator_length;
    yaml_string_t string;

    indicator_length = strlen(indicator);
    STRING_ASSIGN(string, (yaml_char_t *)indicator, indicator_length);

    if (need_whitespace && !emitter->whitespace) {
        if (!PUT(emitter, ' ')) return 0;
    }

    while (string.pointer != string.end) {
        if (!WRITE(emitter, string)) return 0;
    }

    emitter->whitespace = is_whitespace;
    emitter->indention = (emitter->indention && is_indention);
    emitter->open_ended = 0;

    return 1;
}